

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
slang::SmallVectorBase<slang::Diagnostic>::pop_back(SmallVectorBase<slang::Diagnostic> *this)

{
  size_type sVar1;
  
  if (this->len != 0) {
    sVar1 = this->len - 1;
    this->len = sVar1;
    Diagnostic::~Diagnostic(this->data_ + sVar1);
    return;
  }
  assert::assertFailed
            ("len",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
             ,0x97,
             "void slang::SmallVectorBase<slang::Diagnostic>::pop_back() [T = slang::Diagnostic]");
}

Assistant:

void pop_back() {
        ASSERT(len);
        len--;
        std::destroy_at(data_ + len);
    }